

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vod_common.cpp
# Opt level: O0

string * toNativeSeparators(string *__return_storage_ptr__,string *dirName)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string *dirName_local;
  string *rez;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)dirName);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if ((*pcVar3 == '\\') || (*pcVar3 == '/')) {
      cVar2 = getDirSeparator();
      *pcVar3 = cVar2;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toNativeSeparators(const std::string& dirName)
{
    std::string rez = dirName;
    for (char& c : rez)
    {
        if (c == '\\' || c == '/')
            c = getDirSeparator();
    }
    return rez;
}